

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_numeric_suite.cpp
# Opt level: O3

void accumulate_suite::test_overfull(void)

{
  bool bVar1;
  reference piVar2;
  reference piVar3;
  int iVar4;
  initializer_list<int> input;
  array<int,_4UL> array;
  circular_view<int,_18446744073709551615UL> span;
  basic_iterator<int> local_78;
  iterator_type local_68;
  type local_58 [6];
  circular_view<int,_18446744073709551615UL> local_40;
  
  local_40.member.data = local_58;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_40.member.cap = 4;
  local_40.member.size = 0;
  local_40.member.next = 4;
  local_78.parent = (view_pointer)0x160000000b;
  local_78.current = 0x2c00000021;
  input._M_len = 4;
  input._M_array = (iterator)&local_78;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_40,input);
  local_68.current = local_40.member.cap * 2;
  if ((local_68.current & local_40.member.cap * 2 - 1) == 0) {
    local_78.current = local_40.member.next - local_40.member.size & local_68.current - 1;
    local_68.current = local_68.current - 1 & local_40.member.next;
  }
  else {
    local_78.current = (local_40.member.next - local_40.member.size) % local_68.current;
    local_68.current = local_40.member.next % local_68.current;
  }
  local_78.parent = &local_40;
  local_68.parent = &local_40;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_78,&local_68);
  iVar4 = 0;
  if (!bVar1) {
    iVar4 = 0;
    do {
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_78);
      iVar4 = iVar4 + *piVar2;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_78);
      bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                        (&local_78,&local_68);
    } while (!bVar1);
  }
  local_78.parent = (view_pointer)CONCAT44(local_78.parent._4_4_,iVar4);
  local_68.parent = (view_pointer)CONCAT44(local_68.parent._4_4_,0x6e);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("std::accumulate(span.begin(), span.end(), 0)","11 + 22 + 33 + 44",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_numeric_suite.cpp"
             ,0x1d,"void accumulate_suite::test_overfull()",&local_78,&local_68);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_40,1);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_40);
  *piVar3 = 0x37;
  local_68.current = local_40.member.cap * 2;
  if ((local_68.current & local_40.member.cap * 2 - 1) == 0) {
    local_78.current = local_40.member.next - local_40.member.size & local_68.current - 1;
    local_68.current = local_68.current - 1 & local_40.member.next;
  }
  else {
    local_78.current = (local_40.member.next - local_40.member.size) % local_68.current;
    local_68.current = local_40.member.next % local_68.current;
  }
  local_78.parent = &local_40;
  local_68.parent = &local_40;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_78,&local_68);
  iVar4 = 0;
  if (!bVar1) {
    iVar4 = 0;
    do {
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_78);
      iVar4 = iVar4 + *piVar2;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_78);
      bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                        (&local_78,&local_68);
    } while (!bVar1);
  }
  local_78.parent = (view_pointer)CONCAT44(local_78.parent._4_4_,iVar4);
  local_68.parent = (view_pointer)CONCAT44(local_68.parent._4_4_,0x9a);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("std::accumulate(span.begin(), span.end(), 0)","22 + 33 + 44 + 55",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_numeric_suite.cpp"
             ,0x1f,"void accumulate_suite::test_overfull()",&local_78,&local_68);
  return;
}

Assistant:

void test_overfull()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    span = { 11, 22, 33, 44 };
    BOOST_TEST_EQ(std::accumulate(span.begin(), span.end(), 0), 11 + 22 + 33 + 44);
    span.push_back(55);
    BOOST_TEST_EQ(std::accumulate(span.begin(), span.end(), 0), 22 + 33 + 44 + 55);
}